

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_mixer.cpp
# Opt level: O0

cubeb_channel_layout cubeb_channel_layout_check(cubeb_channel_layout l,uint32_t c)

{
  uint32_t c_local;
  cubeb_channel_layout l_local;
  undefined4 local_4;
  
  local_4 = l;
  if (l == 0) {
    if (c == 1) {
      local_4 = 4;
    }
    else if (c == 2) {
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static cubeb_channel_layout
cubeb_channel_layout_check(cubeb_channel_layout l, uint32_t c)
{
    if (l == CUBEB_LAYOUT_UNDEFINED) {
      switch (c) {
        case 1: return CUBEB_LAYOUT_MONO;
        case 2: return CUBEB_LAYOUT_STEREO;
      }
    }
    return l;
}